

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramFunction<duckdb::DefaultMapType<std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>>
     ::
     Combine<duckdb::HistogramAggState<bool,std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>>>
               (HistogramAggState<bool,_std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
                *source,HistogramAggState<bool,_std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
                        *target,AggregateInputData *input_data)

{
  bool bVar1;
  unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
  *puVar2;
  reference ppVar3;
  mapped_type *pmVar4;
  long *in_RSI;
  long *in_RDI;
  pair<const_bool,_unsigned_long> *entry;
  iterator __end0;
  iterator __begin0;
  unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
  *__range3;
  unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
  *in_stack_ffffffffffffffb8;
  ArenaAllocator *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_bool,_unsigned_long>,_false> local_30;
  _Node_iterator_base<std::pair<const_bool,_unsigned_long>,_false> local_28;
  long local_20;
  long *local_10;
  long *local_8;
  
  if (*in_RDI != 0) {
    local_8 = in_RDI;
    if (*in_RSI == 0) {
      local_10 = in_RSI;
      puVar2 = DefaultMapType<std::unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>_>
               ::CreateEmpty(in_stack_ffffffffffffffc0);
      *local_10 = (long)puVar2;
    }
    local_20 = *local_8;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffffb8);
    while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false> *)
                         0xba5ea1);
      puVar2 = (unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
                *)ppVar3->second;
      pmVar4 = std::
               unordered_map<bool,_unsigned_long,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<std::pair<const_bool,_unsigned_long>_>_>
               ::operator[](puVar2,(key_type *)in_stack_ffffffffffffffb8);
      *pmVar4 = (long)&(puVar2->_M_h)._M_buckets + *pmVar4;
      std::__detail::_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_bool,_unsigned_long>,_false,_false> *)puVar2);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}